

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetUserVar
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PField *pPVar5;
  DObject *self;
  char *pcVar6;
  bool bVar7;
  FName local_24;
  PClass *pPVar4;
  
  pPVar2 = DObject::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003db065;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (DObject *)0x0) {
        pPVar4 = self->Class;
        if (pPVar4 == (PClass *)0x0) {
          iVar3 = (**self->_vptr_DObject)(self);
          pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
          self->Class = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DObject))";
          goto LAB_003db065;
        }
        goto LAB_003daff1;
      }
    }
    else if (self != (DObject *)0x0) goto LAB_003db055;
    self = (DObject *)0x0;
LAB_003daff1:
    if (numparam == 1) {
      pcVar6 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if (numparam < 3) {
          pcVar6 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            uVar1 = param[2].field_0.i;
            pPVar5 = GetVar(self,&local_24);
            if (pPVar5 != (PField *)0x0) {
              (*(pPVar5->Type->super_PTypeBase).super_DObject._vptr_DObject[0xf])
                        (pPVar5->Type,(long)&self->_vptr_DObject + pPVar5->Offset,(ulong)uVar1);
            }
            return 0;
          }
          pcVar6 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1304,
                      "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar6 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1303,
                  "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003db055:
  pcVar6 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003db065:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1302,
                "int AF_AActor_A_SetUserVar(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetUserVar)
{
	PARAM_SELF_PROLOGUE(DObject);
	PARAM_NAME	(varname);
	PARAM_INT	(value);

	// Set the value of the specified user variable.
	PField *var = GetVar(self, varname);
	if (var != nullptr)
	{
		var->Type->SetValue(reinterpret_cast<BYTE *>(self) + var->Offset, value);
	}
	return 0;
}